

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O3

void Qiniu_Region_Set_Api_Alternative_Hosts
               (Qiniu_Region *region,char **hosts,size_t hostsCount,Qiniu_Bool useHttps)

{
  _Qiniu_Region_Service *p_Var1;
  _Qiniu_Region_Service *p_Var2;
  
  if (region != (Qiniu_Region *)0x0) {
    p_Var2 = region->apiService;
    if (p_Var2 != (_Qiniu_Region_Service *)0x0) {
      p_Var1 = _Qiniu_Region_Service_New
                         (p_Var2->hosts,p_Var2->acceleratedHostsCount,
                          p_Var2->hosts + p_Var2->acceleratedHostsCount,p_Var2->preferredHostsCount,
                          hosts,hostsCount,useHttps);
      region->apiService = p_Var1;
      _Qiniu_Region_Service_Free(p_Var2);
      return;
    }
    p_Var2 = _Qiniu_Region_Service_New((char **)0x0,0,(char **)0x0,0,hosts,hostsCount,useHttps);
    region->apiService = p_Var2;
  }
  return;
}

Assistant:

void Qiniu_Region_Set_Api_Alternative_Hosts(Qiniu_Region *region, const char *const *hosts, size_t hostsCount, Qiniu_Bool useHttps)
{
    if (region == NULL)
    {
        return;
    }
    if (region->apiService != NULL)
    {
        struct _Qiniu_Region_Service *oldApiService = region->apiService;
        region->apiService = _Qiniu_Region_Service_New(
            oldApiService->hosts, oldApiService->acceleratedHostsCount,
            oldApiService->hosts + oldApiService->acceleratedHostsCount, oldApiService->preferredHostsCount,
            hosts, hostsCount,
            useHttps);
        _Qiniu_Region_Service_Free(oldApiService);
    }
    else
    {
        region->apiService = _Qiniu_Region_Service_New(NULL, 0, NULL, 0, hosts, hostsCount, useHttps);
    }
}